

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

AnnotatedHandler * __thiscall
capnp::JsonCodec::loadAnnotatedHandler
          (JsonCodec *this,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>
  *table;
  Impl *pIVar1;
  Entry *pEVar2;
  RemoveConst<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
  *pRVar3;
  word *pwVar4;
  long *plVar5;
  undefined8 uVar6;
  Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_> *pMVar7;
  None *pNVar8;
  size_t newSize;
  Entry *pEVar9;
  AnnotatedHandler *pAVar10;
  bool bVar11;
  Maybe<unsigned_long> MVar12;
  Type type;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Entry local_e0;
  anon_union_8_2_eba6ea51_for_Type_5 local_c0;
  Disposer *local_b8;
  Fault local_b0;
  DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_a8;
  Vector<capnp::Schema> *local_80;
  Reader local_78;
  ArrayPtr<const_char> local_40;
  
  pIVar1 = (this->impl).ptr;
  table = &pIVar1->annotatedHandlers;
  local_e0.key._0_8_ = &DAT_00000010;
  local_e0.value.ptr.disposer = (Disposer *)0x0;
  local_e0.value.ptr.ptr = (AnnotatedHandler *)0x0;
  local_e0.key.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  local_c0 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  local_80 = dependencies;
  MVar12 = kj::
           Table<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Callbacks>_>
           ::Impl<0UL,_false>::insert
                     ((Impl<0UL,_false> *)&local_78,&table->table,
                      (long)(pIVar1->annotatedHandlers).table.rows.builder.pos -
                      (long)(pIVar1->annotatedHandlers).table.rows.builder.ptr >> 5,&local_e0,
                      0xffffffff);
  pAVar10 = local_e0.value.ptr.ptr;
  if (local_78._reader.segment._0_1_ == (Impl<0UL,_false>)0x1) {
    pEVar9 = (table->table).rows.builder.ptr;
    local_a8.left = &pEVar9[(long)local_78._reader.capTable].value;
    local_b8 = local_e0.value.ptr.disposer;
    local_e0.value.ptr.ptr = (AnnotatedHandler *)0x0;
    bVar11 = pEVar9[(long)local_78._reader.capTable].value.ptr.ptr == (AnnotatedHandler *)0x0;
    local_a8.right = (None *)&kj::none;
    local_a8.op.content.ptr = " != ";
    local_a8.op.content.size_ = 5;
    local_a8.result = !bVar11;
    if (bVar11) {
      Schema::getProto(&local_78,(Schema *)&local_c0);
      local_40 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_78);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[32],capnp::Text::Reader>
                (&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x5ad,FAILED,"existing != kj::none",
                 "_kjCondition,\"cyclic JSON flattening detected\", schema.getProto().getDisplayName()"
                 ,&local_a8,(char (*) [32])"cyclic JSON flattening detected",(Reader *)&local_40);
      kj::_::Debug::Fault::fatal(&local_b0);
    }
    if (pAVar10 != (AnnotatedHandler *)0x0) {
      (**(local_e0.value.ptr.disposer)->_vptr_Disposer)
                (local_e0.value.ptr.disposer,
                 (_func_int *)
                 ((long)&(pAVar10->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                         super_HandlerBase._vptr_HandlerBase +
                 (long)(pAVar10->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                       super_HandlerBase._vptr_HandlerBase[-2]),MVar12.ptr.field_1.value);
    }
    pEVar9 = (table->table).rows.builder.ptr + (long)local_78._reader.capTable;
  }
  else {
    pEVar9 = (pIVar1->annotatedHandlers).table.rows.builder.endPtr;
    if ((pIVar1->annotatedHandlers).table.rows.builder.pos == pEVar9) {
      pEVar2 = (table->table).rows.builder.ptr;
      newSize = 4;
      if (pEVar9 != pEVar2) {
        newSize = (long)pEVar9 - (long)pEVar2 >> 4;
      }
      kj::
      Vector<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry>
      ::setCapacity((Vector<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry>
                     *)table,newSize);
    }
    uVar6 = local_e0.key._0_8_;
    pRVar3 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    (pRVar3->key).baseType = local_e0.key.baseType;
    (pRVar3->key).listDepth = local_e0.key.listDepth;
    (pRVar3->key).isImplicitParam = local_e0.key.isImplicitParam;
    (pRVar3->key).field_3 = local_e0.key.field_3;
    *(undefined2 *)&(pRVar3->key).field_0x6 = local_e0.key._6_2_;
    *(undefined4 *)&(pRVar3->key).field_4 = local_e0.key.field_4.scopeId._0_4_;
    *(undefined4 *)((long)&(pRVar3->key).field_4 + 4) = local_e0.key.field_4.scopeId._4_4_;
    (pRVar3->value).ptr.disposer = local_e0.value.ptr.disposer;
    (pRVar3->value).ptr.ptr = local_e0.value.ptr.ptr;
    local_e0.value.ptr.ptr = (AnnotatedHandler *)0x0;
    pEVar9 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    (pIVar1->annotatedHandlers).table.rows.builder.pos = pEVar9 + 1;
    local_e0.key._0_8_ = uVar6;
  }
  pAVar10 = local_e0.value.ptr.ptr;
  if (local_e0.value.ptr.ptr != (AnnotatedHandler *)0x0) {
    local_e0.value.ptr.ptr = (AnnotatedHandler *)0x0;
    (**(local_e0.value.ptr.disposer)->_vptr_Disposer)
              (local_e0.value.ptr.disposer,
               (_func_int *)
               ((long)&(pAVar10->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                       super_HandlerBase._vptr_HandlerBase +
               (long)(pAVar10->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                     super_HandlerBase._vptr_HandlerBase[-2]));
  }
  if ((pEVar9->value).ptr.ptr == (AnnotatedHandler *)0x0) {
    kj::
    heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
              ((kj *)&local_a8,this,(StructSchema *)&local_c0,discriminator,unionDeclName,local_80);
    pAVar10 = (AnnotatedHandler *)local_a8.right;
    pMVar7 = local_a8.left;
    local_a8.right = (None *)0x0;
    kj::
    Table<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Callbacks>>
    ::find<0ul,capnp::StructSchema&>
              ((Table<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Callbacks>>
                *)&local_78,(StructSchema *)&((this->impl).ptr)->annotatedHandlers);
    if (local_78._reader.segment == (SegmentReader *)0x0) {
      local_e0.key.baseType = VOID;
      local_e0.key.listDepth = '\0';
      local_e0.key.isImplicitParam = false;
      local_e0.key.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      local_e0.key._6_2_ = 0;
      local_78._reader.segment = (SegmentReader *)0x0;
      local_78._reader.capTable = (CapTableReader *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_e0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_e0);
    }
    pwVar4 = ((local_78._reader.segment)->ptr).ptr;
    plVar5 = (long *)((local_78._reader.segment)->ptr).size_;
    ((local_78._reader.segment)->ptr).ptr = (word *)pMVar7;
    ((local_78._reader.segment)->ptr).size_ = (size_t)pAVar10;
    if (plVar5 != (long *)0x0) {
      (**(code **)pwVar4->content)(pwVar4,(long)plVar5 + *(long *)(*plVar5 + -0x10));
    }
    type.field_4.schema = local_c0.schema;
    type.baseType = STRUCT;
    type.listDepth = '\0';
    type.isImplicitParam = false;
    type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    type._6_2_ = 0;
    addTypeHandlerImpl(this,type,(HandlerBase *)pAVar10);
    pNVar8 = local_a8.right;
    if (local_a8.right != (None *)0x0) {
      local_a8.right = (None *)0x0;
      (*(code *)(((local_a8.left)->ptr).disposer)->_vptr_Disposer)
                (local_a8.left,pNVar8 + *(long *)(*(long *)pNVar8 + -0x10));
    }
  }
  else {
    pAVar10 = (pEVar9->value).ptr.ptr;
  }
  return pAVar10;
}

Assistant:

JsonCodec::AnnotatedHandler& JsonCodec::loadAnnotatedHandler(
      StructSchema schema, kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
      kj::Maybe<kj::StringPtr> unionDeclName, kj::Vector<Schema>& dependencies) {
  auto& entry = impl->annotatedHandlers.upsert(schema, kj::none,
      [&](kj::Maybe<kj::Own<AnnotatedHandler>>& existing, auto dummy) {
    KJ_ASSERT(existing != kj::none,
        "cyclic JSON flattening detected", schema.getProto().getDisplayName());
  });

  KJ_IF_SOME(v, entry.value) {
    // Already exists.
    return *v;
  } else {
    // Not seen before.
    auto newHandler = kj::heap<AnnotatedHandler>(
          *this, schema, discriminator, unionDeclName, dependencies);
    auto& result = *newHandler;

    // Map may have changed, so we have to look up again.
    KJ_ASSERT_NONNULL(impl->annotatedHandlers.find(schema)) = kj::mv(newHandler);

    addTypeHandler(schema, result);
    return result;
  }